

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

void __thiscall
nuraft::nuraft_global_mgr::init_raft_server(nuraft_global_mgr *this,raft_server *server)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  long in_RSI;
  long in_RDI;
  ptr<logger> *l_;
  string local_38 [32];
  __shared_ptr *local_18;
  
  local_18 = (__shared_ptr *)(in_RSI + 0x318);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2bc265);
    iVar2 = (*peVar3->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2bc281);
      msg_if_given_abi_cxx11_
                ((char *)local_38,"global manager detected, %zu commit workers, %zu append workers",
                 *(undefined8 *)(in_RDI + 0x38),*(undefined8 *)(in_RDI + 0x40));
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                 ,"init_raft_server",0xa2,local_38);
      std::__cxx11::string::~string(local_38);
    }
  }
  return;
}

Assistant:

void nuraft_global_mgr::init_raft_server(raft_server* server) {
    ptr<logger>& l_ = server->l_;
    p_in("global manager detected, %zu commit workers, %zu append workers",
         config_.num_commit_threads_,
         config_.num_append_threads_);
}